

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int accept_connection(int socket_descriptor,int busy_waiting)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int in_EDI;
  socklen_t length;
  int connection;
  sockaddr_un client;
  int in_stack_ffffffffffffff7c;
  socklen_t socket_fd;
  sockaddr local_76 [6];
  int local_8;
  int local_4;
  
  socket_fd = 0x6e;
  local_8 = in_ESI;
  local_4 = in_EDI;
  iVar1 = accept(in_EDI,local_76,(socklen_t *)&stack0xffffffffffffff80);
  if (iVar1 == -1) {
    throw((char *)0x10261a);
  }
  set_socket_both_buffer_sizes(0);
  if ((local_8 != 0) && (iVar2 = set_io_flag(socket_fd,in_stack_ffffffffffffff7c), iVar2 == -1)) {
    throw((char *)0x10264c);
  }
  close(local_4);
  return iVar1;
}

Assistant:

int accept_connection(int socket_descriptor, int busy_waiting) {
	struct sockaddr_un client;
	int connection;
	socklen_t length = sizeof client;

	// Start accepting connections on this socket and
	// receive a connection-specific socket for any
	// incoming socket
	// clang-format off
	connection = accept(
		socket_descriptor,
		(struct sockaddr*)&client,
		&length
	);
	// clang-format on

	if (connection == -1) {
		throw("Error accepting connection");
	}

	set_socket_both_buffer_sizes(connection);

	if (busy_waiting) {
		// adjust_socket_blocking_timeout(connection, 0, 1);
		if (set_io_flag(connection, O_NONBLOCK) == -1) {
			throw("Error setting socket to non-blocking on server-side");
		}
	}

	// Don't need this one anymore (because we only have one connection)
	close(socket_descriptor);

	return connection;
}